

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
ParserValidationErrorTest_ResolvedUndefinedOptionError_Test::TestBody
          (ParserValidationErrorTest_ResolvedUndefinedOptionError_Test *this)

{
  DescriptorPool *this_00;
  Descriptor *pDVar1;
  FileDescriptor *pFVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar4;
  InternalMetadata arena;
  Arena *pAVar5;
  pointer *__ptr;
  char *in_R9;
  string_view text;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_248;
  AssertHelper local_240;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FileDescriptorProto other_file;
  FileDescriptorProto descriptor_proto;
  
  FileDescriptorProto::FileDescriptorProto(&descriptor_proto);
  pDVar1 = DescriptorProto::GetDescriptor();
  FileDescriptor::CopyTo(pDVar1->file_,&descriptor_proto);
  this_00 = &(this->super_ParserValidationErrorTest).pool_;
  pFVar2 = DescriptorPool::BuildFile(this_00,&descriptor_proto);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = pFVar2 != (FileDescriptor *)0x0;
  if (pFVar2 == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&other_file,(internal *)&gtest_ar_,
               (AssertionResult *)"pool_.BuildFile(descriptor_proto) != nullptr","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xa29,(char *)other_file.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    std::__cxx11::string::~string((string *)&other_file);
    if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    FileDescriptorProto::FileDescriptorProto(&other_file);
    other_file.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
         other_file.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
    arena = other_file.super_Message.super_MessageLite._internal_metadata_;
    if ((other_file.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      arena.ptr_ = *(undefined8 *)
                    (other_file.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                    0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set
              (&other_file.field_0._impl_.name_,"base2.proto",(Arena *)arena.ptr_);
    other_file.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
         other_file.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
    if ((other_file.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      other_file.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           *(undefined8 *)
            (other_file.super_Message.super_MessageLite._internal_metadata_.ptr_ &
            0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set
              (&other_file.field_0._impl_.package_,"baz",
               (Arena *)other_file.super_Message.super_MessageLite._internal_metadata_.ptr_);
    protobuf::internal::RepeatedPtrFieldBase::AddString
              (&other_file.field_0._impl_.dependency_.super_RepeatedPtrFieldBase);
    FileDescriptorProto::set_dependency<std::__cxx11::string_const&>
              (&other_file,0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)descriptor_proto.field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc))
    ;
    pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                       (&other_file.field_0._impl_.message_type_.super_RepeatedPtrFieldBase);
    *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 1;
    pAVar5 = (Arena *)(pVVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set(&(pVVar3->field_0)._impl_.name_,"Bar",pAVar5);
    pVVar4 = protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&(pVVar3->field_0)._impl_.field_.super_RepeatedPtrFieldBase);
    *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 1;
    pAVar5 = (Arena *)(pVVar4->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set(&(pVVar4->field_0)._impl_.name_,"foo",pAVar5);
    (pVVar4->field_0)._impl_.number_ = 1;
    *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 0x40;
    FieldDescriptorProto::set_label(pVVar4,FieldDescriptorProto_Label_LABEL_OPTIONAL);
    FieldDescriptorProto::set_type(pVVar4,FieldDescriptorProto_Type_TYPE_INT32);
    pVVar4 = protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&other_file.field_0._impl_.extension_.super_RepeatedPtrFieldBase);
    *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 1;
    pAVar5 = (Arena *)(pVVar4->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set(&(pVVar4->field_0)._impl_.name_,"bar",pAVar5);
    (pVVar4->field_0)._impl_.number_ = 0x7513b5;
    *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 0x40;
    FieldDescriptorProto::set_label(pVVar4,FieldDescriptorProto_Label_LABEL_OPTIONAL);
    FieldDescriptorProto::set_type(pVVar4,FieldDescriptorProto_Type_TYPE_MESSAGE);
    *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 4;
    pAVar5 = (Arena *)(pVVar4->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set(&(pVVar4->field_0)._impl_.type_name_,"Bar",pAVar5);
    *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 2;
    pAVar5 = (Arena *)(pVVar4->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set
              (&(pVVar4->field_0)._impl_.extendee_,"google.protobuf.FileOptions",pAVar5);
    pFVar2 = DescriptorPool::BuildFile(this_00,&other_file);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ = pFVar2 != (FileDescriptor *)0x0;
    if (!gtest_ar__1.success_) {
      testing::Message::Message((Message *)&local_248);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                 (AssertionResult *)"pool_.BuildFile(other_file) != nullptr","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                 ,0xa46,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
      testing::internal::AssertHelper::operator=(&local_240,(Message *)&local_248);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if (local_248._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_248._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    testing::
    Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_,
            "2:7: Option \"(baz.bar)\" is resolved to \"(qux.baz.bar)\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"(.baz.bar)\") to start from the outermost scope.\n"
           );
    text._M_str = "package qux.baz;\nimport \"base2.proto\";\noption (baz.bar).foo = 1;\n";
    text._M_len = 0x41;
    ParserTest::ExpectHasValidationErrors
              (&this->super_ParserValidationErrorTest,text,
               (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&gtest_ar_);
    testing::internal::
    MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_);
    FileDescriptorProto::~FileDescriptorProto(&other_file);
  }
  FileDescriptorProto::~FileDescriptorProto(&descriptor_proto);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, ResolvedUndefinedOptionError) {
  // Build descriptor message in test pool
  FileDescriptorProto descriptor_proto;
  DescriptorProto::descriptor()->file()->CopyTo(&descriptor_proto);
  ASSERT_TRUE(pool_.BuildFile(descriptor_proto) != nullptr);

  // base2.proto:
  //   package baz
  //   import google/protobuf/descriptor.proto
  //   message Bar { optional int32 foo = 1; }
  //   extend FileOptions { optional Bar bar = 7672757; }
  FileDescriptorProto other_file;
  other_file.set_name("base2.proto");
  other_file.set_package("baz");
  other_file.add_dependency();
  other_file.set_dependency(0, descriptor_proto.name());

  DescriptorProto* message(other_file.add_message_type());
  message->set_name("Bar");
  FieldDescriptorProto* field(message->add_field());
  field->set_name("foo");
  field->set_number(1);
  field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  field->set_type(FieldDescriptorProto::TYPE_INT32);

  FieldDescriptorProto* extension(other_file.add_extension());
  extension->set_name("bar");
  extension->set_number(7672757);
  extension->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  extension->set_type(FieldDescriptorProto::TYPE_MESSAGE);
  extension->set_type_name("Bar");
  extension->set_extendee("google.protobuf.FileOptions");

  EXPECT_TRUE(pool_.BuildFile(other_file) != nullptr);

  // qux.proto:
  //   package qux.baz
  //   option (baz.bar).foo = 1;
  //
  // Although "baz.bar" is already defined, the lookup code will try
  // "qux.baz.bar", since it's the match from the innermost scope,
  // which will cause a symbol not defined error.
  ExpectHasValidationErrors(
      "package qux.baz;\n"
      "import \"base2.proto\";\n"
      "option (baz.bar).foo = 1;\n",
      "2:7: Option \"(baz.bar)\" is resolved to \"(qux.baz.bar)\","
      " which is not defined. The innermost scope is searched first "
      "in name resolution. Consider using a leading '.'(i.e., \"(.baz.bar)\")"
      " to start from the outermost scope.\n");
}